

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

bool __thiscall pbrt::StatsAccumulator::PrintCheckRare(StatsAccumulator *this,FILE *dest)

{
  float fVar1;
  double dVar2;
  _Base_ptr p_Var3;
  bool bVar4;
  _Rb_tree_header *p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM5_Qb;
  
  p_Var3 = (this->stats->rareChecks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->stats->rareChecks)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var5) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    do {
      auVar6._0_8_ = (double)(long)p_Var3[2]._M_parent / (double)(long)p_Var3[2]._M_left;
      auVar6._8_8_ = in_XMM5_Qb;
      auVar7._0_4_ = (float)auVar6._0_8_;
      auVar7._4_12_ = auVar6._4_12_;
      dVar2 = (1.0 / (double)(long)((long)&p_Var3[2]._M_left[-1]._M_right + 7)) *
              (double)auVar7._0_4_ * (double)(1.0 - auVar7._0_4_);
      auVar8._0_4_ = (float)dVar2;
      auVar8._4_4_ = (int)((ulong)dVar2 >> 0x20);
      auVar8._8_8_ = 0;
      auVar6 = vfmadd231ss_fma(auVar7,auVar8,ZEXT416(0xc0000000));
      fVar1 = (float)p_Var3[2]._M_color;
      if (fVar1 <= auVar6._0_4_) {
        fprintf((FILE *)dest,
                "%s @ %.9g failures was %fx over limit %.9g (%ld samples, sigma est %.9g)\n",
                (double)auVar7._0_4_,(double)(auVar7._0_4_ / fVar1),(double)fVar1,
                (double)auVar8._0_4_,*(undefined8 *)(p_Var3 + 1));
        bVar4 = true;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  return bVar4;
}

Assistant:

bool StatsAccumulator::PrintCheckRare(FILE *dest) {
    bool anyFailed = false;
    for (const auto &iter : stats->rareChecks) {
        const Stats::RareCheck &rc = iter.second;
        Float trueFreq = double(rc.numTrue) / double(rc.total);
        Float varianceEstimate = 1 / double(rc.total - 1) * trueFreq * (1 - trueFreq);
        if (trueFreq - 2 * varianceEstimate >= rc.maxFrequency) {
            fprintf(dest,
                    "%s @ %.9g failures was %fx over limit %.9g (%" PRId64
                    " samples, sigma est %.9g)\n",
                    iter.first.c_str(), trueFreq, trueFreq / rc.maxFrequency,
                    rc.maxFrequency, rc.total, varianceEstimate);
            anyFailed = true;
        }
    }
    return anyFailed;
}